

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O3

void __thiscall HighsSimplexAnalysis::invertReport(HighsSimplexAnalysis *this)

{
  if (*(this->log_options).log_dev_level != 0) {
    if ((0x31 < (uint)this->num_invert_report_since_last_header) ||
       (-1 < this->num_iteration_report_since_last_header)) {
      invertReport(this,true);
      this->num_invert_report_since_last_header = 0;
    }
    invertReport(this,false);
    if (this->rebuild_reason == 0) {
      this->num_iteration_report_since_last_header = -1;
    }
    return;
  }
  userInvertReport(this,false);
  return;
}

Assistant:

void HighsSimplexAnalysis::invertReport() {
  if (*log_options.log_dev_level) {
    const bool header = (num_invert_report_since_last_header < 0) ||
                        (num_invert_report_since_last_header > 49) ||
                        (num_iteration_report_since_last_header >= 0);
    if (header) {
      invertReport(header);
      num_invert_report_since_last_header = 0;
    }
    invertReport(false);
    // Force an iteration report header if this is an INVERT report without an
    // rebuild_reason
    if (!rebuild_reason) num_iteration_report_since_last_header = -1;
  } else {
    const bool force = false;
    userInvertReport(force);
  }
}